

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O0

void __thiscall mnf::Manifold::~Manifold(Manifold *this)

{
  code *pcVar1;
  Manifold *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Manifold::~Manifold() {}